

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

int __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::dimension
          (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *this,Siblings *curr_sib)

{
  undefined4 local_1c;
  Siblings *pSStack_18;
  int dim;
  Siblings *curr_sib_local;
  Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *this_local;
  
  local_1c = -1;
  for (pSStack_18 = curr_sib;
      pSStack_18 !=
      (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>
       *)0x0; pSStack_18 = Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>
                           ::oncles(pSStack_18)) {
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

int dimension(Siblings const* curr_sib) const {
    int dim = -1;
    while (curr_sib != nullptr) {
      ++dim;
      curr_sib = curr_sib->oncles();
    }
    return dim;
  }